

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O1

Vec_Ptr_t * Aig_ManSupportsRegisters(Aig_Man_t *p)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  void *__ptr;
  void *__ptr_00;
  Vec_Ptr_t *__ptr_01;
  Vec_Ptr_t *pVVar4;
  void **__s;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  
  __ptr_01 = Aig_ManSupports(p);
  uVar1 = p->nRegs;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  uVar5 = 8;
  if (6 < uVar1 - 1) {
    uVar5 = uVar1;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = uVar5;
  if (uVar5 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)(int)uVar5 << 3);
  }
  pVVar4->pArray = __s;
  pVVar4->nSize = uVar1;
  memset(__s,0,(long)(int)uVar1 << 3);
  iVar2 = __ptr_01->nSize;
  if (0 < (long)iVar2) {
    ppvVar3 = __ptr_01->pArray;
    lVar11 = 0;
    do {
      __ptr = ppvVar3[lVar11];
      if (*(int *)((long)__ptr + 4) < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x396,"int Vec_IntPop(Vec_Int_t *)");
      }
      __ptr_00 = *(void **)((long)__ptr + 8);
      uVar5 = *(int *)((long)__ptr + 4) - 1;
      *(uint *)((long)__ptr + 4) = uVar5;
      uVar5 = (p->nRegs - p->nObjs[3]) + *(int *)((long)__ptr_00 + (ulong)uVar5 * 4);
      if ((int)uVar5 < 0) {
        if (__ptr_00 != (void *)0x0) {
          free(__ptr_00);
          *(undefined8 *)((long)__ptr + 8) = 0;
        }
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
      }
      else {
        uVar8 = *(uint *)((long)__ptr + 4);
        uVar9 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar6 = 0;
        }
        else {
          lVar7 = 0;
          uVar6 = 0;
          do {
            iVar10 = (p->nRegs - p->nObjs[2]) + *(int *)((long)__ptr_00 + lVar7 * 4);
            if (-1 < iVar10) {
              if (p->nRegs <= iVar10) {
                __assert_fail("iIn < Aig_ManRegNum(p)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPart.c"
                              ,0x1bc,"Vec_Ptr_t *Aig_ManSupportsRegisters(Aig_Man_t *)");
              }
              if (((int)uVar6 < 0) || ((int)uVar9 <= (int)uVar6)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              uVar9 = (ulong)uVar6;
              uVar6 = uVar6 + 1;
              *(int *)((long)__ptr_00 + uVar9 * 4) = iVar10;
            }
            lVar7 = lVar7 + 1;
            uVar8 = *(uint *)((long)__ptr + 4);
            uVar9 = (ulong)(int)uVar8;
          } while (lVar7 < (long)uVar9);
        }
        if ((int)uVar8 < (int)uVar6) {
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        *(uint *)((long)__ptr + 4) = uVar6;
        if (p->nRegs <= (int)uVar5) {
          __assert_fail("iOut < Aig_ManRegNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPart.c"
                        ,0x1c1,"Vec_Ptr_t *Aig_ManSupportsRegisters(Aig_Man_t *)");
        }
        if ((int)uVar1 <= (int)uVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        __s[uVar5] = __ptr;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != iVar2);
  }
  if (__ptr_01->pArray != (void **)0x0) {
    free(__ptr_01->pArray);
    __ptr_01->pArray = (void **)0x0;
  }
  if (__ptr_01 != (Vec_Ptr_t *)0x0) {
    free(__ptr_01);
  }
  if (0 < (int)uVar1) {
    uVar9 = 0;
    do {
      if (__s[uVar9] == (void *)0x0) {
        __assert_fail("vSupp != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPart.c"
                      ,0x1c7,"Vec_Ptr_t *Aig_ManSupportsRegisters(Aig_Man_t *)");
      }
      uVar9 = uVar9 + 1;
    } while (uVar1 != uVar9);
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Aig_ManSupportsRegisters( Aig_Man_t * p )
{
    Vec_Ptr_t * vSupports, * vMatrix;
    Vec_Int_t * vSupp;
    int iOut, iIn, k, m, i;
    // get structural supports for each output
    vSupports = Aig_ManSupports( p );
    // transforms the supports into the latch dependency matrix
    vMatrix = Vec_PtrStart( Aig_ManRegNum(p) );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vSupp, i )
    {
        // skip true POs
        iOut = Vec_IntPop( vSupp );
        iOut -= Aig_ManCoNum(p) - Aig_ManRegNum(p);
        if ( iOut < 0 )
        {
            Vec_IntFree( vSupp );
            continue;
        }
        // remove PIs
        m = 0;
        Vec_IntForEachEntry( vSupp, iIn, k )
        {
            iIn -= Aig_ManCiNum(p) - Aig_ManRegNum(p);
            if ( iIn < 0 )
                continue;
            assert( iIn < Aig_ManRegNum(p) );
            Vec_IntWriteEntry( vSupp, m++, iIn );
        }
        Vec_IntShrink( vSupp, m );
        // store support in the matrix
        assert( iOut < Aig_ManRegNum(p) );
        Vec_PtrWriteEntry( vMatrix, iOut, vSupp );
    }
    Vec_PtrFree( vSupports );
    // check that all supports are used
    Vec_PtrForEachEntry( Vec_Int_t *, vMatrix, vSupp, i )
        assert( vSupp != NULL );
    return vMatrix;
}